

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::broadcastToFederates(CommonCore *this,ActionMessage *cmd)

{
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_00000058;
  anon_class_8_1_ba1d3c9a in_stack_00000060;
  
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>::
  apply<helics::CommonCore::broadcastToFederates(helics::ActionMessage&)::__0>
            (in_stack_00000058,in_stack_00000060);
  return;
}

Assistant:

void CommonCore::broadcastToFederates(ActionMessage& cmd)
{
    loopFederates.apply([&cmd](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            cmd.dest_id = fed->global_id;
            fed->addAction(cmd);
        }
    });
}